

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

int Io_ReadPlaSelfSubsumption(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Val1;
  int Val0;
  int iVar;
  int Counter;
  int Res;
  int c2;
  int c1;
  Vec_Bit_t *vMarks_local;
  int nWords_local;
  int nCubes_local;
  word **pCs_local;
  
  Val0 = 0;
  Val1 = -1;
  _c2 = vMarks;
  vMarks_local._0_4_ = nWords;
  vMarks_local._4_4_ = nCubes;
  _nWords_local = pCs;
  Vec_BitFill(vMarks,nCubes,0);
  Res = 0;
  do {
    if (vMarks_local._4_4_ <= Res) {
      return Val0;
    }
    iVar1 = Vec_BitEntry(_c2,Res);
    iVar2 = Res;
    if (iVar1 == 0) {
      do {
        Counter = iVar2 + 1;
        if (vMarks_local._4_4_ <= Counter) goto LAB_003aefad;
        iVar1 = Vec_BitEntry(_c2,Counter);
        iVar2 = Counter;
      } while ((iVar1 != 0) ||
              (iVar = Io_ReadPlaConsensus(_nWords_local[Res],_nWords_local[Counter],
                                          (int)vMarks_local,&Val1), iVar2 = Counter, iVar == 0));
      if ((Val1 < 0) || ((int)vMarks_local * 0x20 <= Val1)) {
        __assert_fail("iVar >= 0 && iVar < nWords*32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadPla.c"
                      ,0xbd,"int Io_ReadPlaSelfSubsumption(word **, int, int, Vec_Bit_t *)");
      }
      iVar2 = Abc_TtGetQua(_nWords_local[Res],Val1);
      iVar1 = Abc_TtGetQua(_nWords_local[Counter],Val1);
      Abc_TtXorQua(_nWords_local[Res],Val1,iVar2);
      Abc_TtXorQua(_nWords_local[Counter],Val1,iVar1);
      iVar3 = Abc_TtImply(_nWords_local[Res],_nWords_local[Counter],(int)vMarks_local);
      if (iVar3 == 0) {
        iVar3 = Abc_TtImply(_nWords_local[Counter],_nWords_local[Res],(int)vMarks_local);
        if (iVar3 == 0) {
          Abc_TtXorQua(_nWords_local[Res],Val1,iVar2);
          Abc_TtXorQua(_nWords_local[Counter],Val1,iVar1);
        }
        else {
          Abc_TtXorQua(_nWords_local[Counter],Val1,iVar1);
          Vec_BitWriteEntry(_c2,Res,1);
          Val0 = Val0 + 1;
        }
      }
      else {
        Abc_TtXorQua(_nWords_local[Res],Val1,iVar2);
        Vec_BitWriteEntry(_c2,Counter,1);
        Val0 = Val0 + 1;
      }
    }
LAB_003aefad:
    Res = Res + 1;
  } while( true );
}

Assistant:

int Io_ReadPlaSelfSubsumption( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0, iVar = -1, Val0, Val1;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaConsensus( pCs[c1], pCs[c2], nWords, &iVar );
                    if ( !Res )
                        continue;
                    assert( iVar >= 0  && iVar < nWords*32 );
                    Val0 = Abc_TtGetQua( pCs[c1], iVar );
                    Val1 = Abc_TtGetQua( pCs[c2], iVar );
                    // remove values
                    Abc_TtXorQua( pCs[c1], iVar, Val0 );
                    Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    // check containment
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                        Counter++;
                    }
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        Counter++;
                        break;
                    }
                    else
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    }

/*
                    printf( "Var = %3d  ", iVar );
                    printf( "Cube0 = %d  ", Abc_TtGetQua(pCs[c1], iVar) );
                    printf( "Cube1 = %d  ", Abc_TtGetQua(pCs[c2], iVar) );
                    printf( "\n" );
                    Io_ReadPlaPrintCube( pCs[c1], 32 * nWords );
                    Io_ReadPlaPrintCube( pCs[c2], 32 * nWords );
                    printf( "\n" );
*/
                    break;
                }
    return Counter;
}